

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInteger64StateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Integer64StateQueryVerifiers::GetFloatVerifier::
verifyUnsignedInteger64GreaterOrEqual
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLuint64 reference)

{
  bool bVar1;
  qpTestResult qVar2;
  float *pfVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  float local_204;
  float local_1e4;
  float local_1c8 [4];
  MessageBuilder local_1b8;
  undefined1 local_34 [8];
  StateQueryMemoryWriteGuard<float> state;
  GLuint64 reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetFloatVerifier *this_local;
  
  state._4_8_ = reference;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float> *)local_34);
  pfVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::operator&
                     ((StateQueryMemoryWriteGuard<float> *)local_34);
  glu::CallLogWrapper::glGetFloatv(&(this->super_StateVerifier).super_CallLogWrapper,name,pfVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float> *)local_34,testCtx);
  if (bVar1) {
    pfVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_float_
                       ((StateQueryMemoryWriteGuard *)local_34);
    local_1e4 = (float)(ulong)state._4_8_;
    if (*pfVar3 < local_1e4) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1b8,(char (*) [40])"// ERROR: expected greater or equal to ");
      local_204 = (float)(ulong)state._4_8_;
      local_1c8[0] = local_204;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b8b5f6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<float> *)local_34)
      ;
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
      }
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyUnsignedInteger64GreaterOrEqual (tcu::TestContext& testCtx, GLenum name, GLuint64 reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat> state;
	glGetFloatv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < GLfloat(reference))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << GLfloat(reference) << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}